

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDElementNSImpl.cpp
# Opt level: O3

DOMNode * __thiscall xercesc_4_0::XSDElementNSImpl::cloneNode(XSDElementNSImpl *this,bool deep)

{
  DOMDocument *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  XSDElementNSImpl *this_00;
  
  pDVar1 = (this->super_DOMElementNSImpl).super_DOMElementImpl.fParent.fOwnerDocument;
  iVar2 = (*(pDVar1->super_DOMNode)._vptr_DOMNode[0x26])
                    (&pDVar1->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
  this_00 = (XSDElementNSImpl *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar2),0xc0);
  XSDElementNSImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers
            (&(this->super_DOMElementNSImpl).super_DOMElementImpl.fNode,NODE_CLONED,(DOMNode *)this,
             (DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * XSDElementNSImpl::cloneNode(bool deep) const {
    DOMNode* newNode = new (fParent.fOwnerDocument) XSDElementNSImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}